

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

char * Cba_ObjGetName(Cba_Ntk_t *p,int i)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  Vec_Str_t *p_00;
  byte *pbVar4;
  byte bVar5;
  char *__file;
  char *__assertion;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x15e,"char *Cba_ObjNameStr(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vObjName).nSize) {
    iVar2 = Vec_IntGetEntry(&p->vObjName,i);
    pcVar3 = Abc_NamStr(p->pDesign->pStrs,iVar2);
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    if (0 < (p->vObjName).nSize) {
      iVar2 = Vec_IntGetEntry(&p->vObjName,i);
      cVar1 = *pcVar3;
      if (cVar1 == '\\') {
        return pcVar3;
      }
      if (cVar1 != '\0') {
        if ((0xc < iVar2) &&
           ((0xe5 < (byte)(cVar1 + 0x85U) || (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)))) {
          bVar5 = pcVar3[1];
          if (bVar5 == 0) {
            return pcVar3;
          }
          pbVar4 = (byte *)(pcVar3 + 2);
          while ((((0xf5 < (byte)(bVar5 - 0x3a) || (0xe5 < (byte)((bVar5 & 0xdf) + 0xa5))) ||
                  (bVar5 == 0x5f)) || (bVar5 == 0x24))) {
            bVar5 = *pbVar4;
            pbVar4 = pbVar4 + 1;
            if (bVar5 == 0) {
              return pcVar3;
            }
          }
        }
        p_00 = Abc_NamBuffer(p->pDesign->pStrs);
        pcVar3 = Vec_StrPrintF(p_00,"\\%s ",pcVar3);
        return pcVar3;
      }
      __assertion = "pName != NULL && *pName != \'\\0\'";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
      ;
      pcVar3 = "int Cba_NameIsLegalInVerilog(char *, int)";
      goto LAB_0034e413;
    }
  }
  __assertion = "Cba_NtkHasObjNames(p)";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h";
  pcVar3 = "int Cba_ObjName(Cba_Ntk_t *, int)";
LAB_0034e413:
  __assert_fail(__assertion,__file,0x15d,pcVar3);
}

Assistant:

char * Cba_ObjGetName( Cba_Ntk_t * p, int i )
{
    char * pName = Cba_ObjNameStr(p, i);
    if ( pName == NULL )
        return pName;
    if ( Cba_NameIsLegalInVerilog(pName, Cba_ObjName(p, i)) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s ", pName );
}